

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O3

bool lexer_tester::test_file(string *filepath)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  pointer pcVar4;
  long *plVar5;
  size_t __n;
  long lVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  istream *piVar12;
  Token *pTVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ostream *poVar15;
  uint uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  undefined8 uVar18;
  pointer pbVar19;
  byte bVar20;
  bool bVar21;
  size_type sVar22;
  string __str_1;
  string value;
  string type;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_tokens;
  path p;
  string path_to_answers;
  ifstream current_stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined1 local_3b8 [8];
  size_type local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined8 local_2a8;
  long *local_2a0 [2];
  long local_290 [2];
  tokenStream *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [16];
  size_type sVar23;
  
  local_2a0[0] = local_290;
  pcVar4 = (filepath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,pcVar4,pcVar4 + filepath->_M_string_length);
  boost::filesystem::path::parent_path();
  paVar2 = &local_338.field_2;
  local_338._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,local_358._M_dataplus._M_p,
             local_358._M_dataplus._M_p + local_358._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_338,"_answers/");
  boost::filesystem::path::stem();
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_338,local_378._M_dataplus._M_p,local_378._M_string_length);
  local_238[0]._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p == paVar14) {
    local_238[0].field_2._0_8_ = paVar14->_M_allocated_capacity;
    local_238[0].field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  }
  else {
    local_238[0].field_2._0_8_ = paVar14->_M_allocated_capacity;
  }
  local_238[0]._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (local_238,".txt");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar11->_M_dataplus)._M_p;
  paVar17 = &pbVar11->field_2;
  if (paVar14 == paVar17) {
    local_278.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_278.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_278.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_278._M_dataplus._M_p = (pointer)paVar14;
  }
  local_278._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,
                    CONCAT71(local_378.field_2._M_allocated_capacity._1_7_,
                             local_378.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar2) {
    operator_delete(local_338._M_dataplus._M_p,
                    CONCAT71(local_338.field_2._M_allocated_capacity._1_7_,
                             local_338.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,
                    CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                             local_358.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::ifstream(local_238);
  std::ifstream::open((string *)local_238,(_Ios_Openmode)&local_278);
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    std::operator+(&local_338,"Error: Cannot open ",&local_278);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_338._M_dataplus._M_p,local_338._M_string_length
                        );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar2) {
      operator_delete(local_338._M_dataplus._M_p,
                      CONCAT71(local_338.field_2._M_allocated_capacity._1_7_,
                               local_338.field_2._M_local_buf[0]) + 1);
    }
    bVar21 = false;
  }
  else {
    pcVar4 = (filepath->_M_dataplus)._M_p;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,pcVar4,pcVar4 + filepath->_M_string_length);
    local_280 = lexer::parsefile(&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_2b8._M_allocated_capacity = 0;
    local_2b8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2a8 = 0;
    local_338._M_string_length = 0;
    local_338.field_2._M_local_buf[0] = '\0';
    local_338._M_dataplus._M_p = (pointer)paVar2;
    while( true ) {
      cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0]._M_dataplus._M_p + -0x18) +
                              (char)local_238);
      piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_238,(string *)&local_338,cVar8);
      if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) break;
      if (local_338._M_string_length != 0) {
        local_2d8._0_8_ = (pointer)0x0;
        local_2d8._8_8_ = (pointer)0x0;
        local_2d8._16_8_ = (pointer)0x0;
        sVar23 = local_338._M_string_length;
        do {
          sVar22 = sVar23 - 1;
          if (sVar23 == 0) {
            sVar22 = 0xffffffffffffffff;
            break;
          }
          lVar6 = sVar23 - 1;
          sVar23 = sVar22;
        } while (local_338._M_dataplus._M_p[lVar6] != ',');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_358,&local_338,0,(long)(int)sVar22);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_378,&local_338,(long)((sVar22 << 0x20) + 0x100000000) >> 0x20,
                   0xffffffffffffffff);
        std::locale::locale((locale *)&local_3f8);
        local_3b8._0_2_ = 0x2000;
        std::locale::locale((locale *)&local_3b0,(locale *)&local_3f8);
        boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
                  (&local_358,(is_classifiedF *)local_3b8);
        std::locale::~locale((locale *)&local_3b0);
        std::locale::~locale((locale *)&local_3f8);
        std::locale::locale((locale *)&local_3f8);
        local_3b8._0_2_ = 0x2000;
        std::locale::locale((locale *)&local_3b0,(locale *)&local_3f8);
        boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
                  (&local_378,(is_classifiedF *)local_3b8);
        std::locale::~locale((locale *)&local_3b0);
        std::locale::~locale((locale *)&local_3f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2b8,&local_378);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2b8,&local_358);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,
                          CONCAT71(local_378.field_2._M_allocated_capacity._1_7_,
                                   local_378.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,
                          CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                                   local_358.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d8);
      }
    }
    pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_2b8._8_8_ + -0x20);
    uVar18 = local_2b8._M_allocated_capacity;
    if (local_2b8._M_allocated_capacity < pbVar11 &&
        local_2b8._M_allocated_capacity != local_2b8._8_8_) {
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar18,
                   pbVar11);
        uVar18 = uVar18 + 0x20;
        pbVar11 = pbVar11 + -1;
      } while ((ulong)uVar18 < pbVar11);
    }
    pTVar13 = tokenStream::getNext(local_280);
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    local_358._M_string_length = 0;
    local_358.field_2._M_local_buf[0] = '\0';
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    local_378._M_string_length = 0;
    local_378.field_2._M_local_buf[0] = '\0';
    if (pTVar13 == (Token *)0x0) {
      bVar21 = true;
    }
    else {
      paVar2 = &local_318.field_2;
      bVar20 = 0;
      do {
        pbVar19 = (pointer)(local_2d8 + 0x10);
        if ((ulong)(local_2b8._8_8_ - local_2b8._0_8_) < 0x21) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ERROR: Answer file doesn\'t have sufficient number of tokens",0x3b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          bVar21 = false;
          goto LAB_0010b8e7;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_358,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2b8._8_8_ + -0x20));
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_2b8._8_8_ + -0x20);
        plVar5 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_2b8._8_8_ + -0x20))->_M_dataplus)._M_p;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_2b8._8_8_ + -0x10);
        local_2b8._8_8_ = pbVar11;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar5 != paVar14) {
          operator_delete(plVar5,paVar14->_M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_378,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2b8._8_8_ + -0x20));
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_2b8._8_8_ + -0x20);
        plVar5 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_2b8._8_8_ + -0x20))->_M_dataplus)._M_p;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_2b8._8_8_ + -0x10);
        local_2b8._8_8_ = pbVar11;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar5 != paVar14) {
          operator_delete(plVar5,paVar14->_M_allocated_capacity + 1);
        }
        local_2d8._8_8_ = (pointer)0x0;
        local_2d8._16_8_ = local_2d8._16_8_ & 0xffffffffffffff00;
        __n = (pTVar13->value)._M_string_length;
        local_2d8._0_8_ = pbVar19;
        if ((__n != local_378._M_string_length) ||
           ((__n != 0 &&
            (iVar9 = bcmp((pTVar13->value)._M_dataplus._M_p,local_378._M_dataplus._M_p,__n),
            iVar9 != 0)))) {
          uVar3 = pTVar13->line_number;
          uVar10 = 1;
          if (9 < uVar3) {
            uVar16 = uVar3;
            uVar7 = 4;
            do {
              uVar10 = uVar7;
              if (uVar16 < 100) {
                uVar10 = uVar10 - 2;
                goto LAB_0010aeb2;
              }
              if (uVar16 < 1000) {
                uVar10 = uVar10 - 1;
                goto LAB_0010aeb2;
              }
              if (uVar16 < 10000) goto LAB_0010aeb2;
              bVar21 = 99999 < uVar16;
              uVar16 = uVar16 / 10000;
              uVar7 = uVar10 + 4;
            } while (bVar21);
            uVar10 = uVar10 + 1;
          }
LAB_0010aeb2:
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_2f8,(ulong)uVar10,'\0');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_2f8._M_dataplus._M_p,(uint)local_2f8._M_string_length,uVar3);
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&local_2f8,0,0,"Error on line ",0xe);
          local_318._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
          paVar14 = &pbVar11->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p == paVar14) {
            local_318.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_318.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_318._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_318.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_318._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_318,",");
          local_3d8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
          paVar14 = &pbVar11->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p == paVar14) {
            local_3d8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_3d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
          }
          else {
            local_3d8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_3d8._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          uVar3 = pTVar13->position_number;
          uVar10 = 1;
          if (9 < uVar3) {
            uVar16 = uVar3;
            uVar7 = 4;
            do {
              uVar10 = uVar7;
              if (uVar16 < 100) {
                uVar10 = uVar10 - 2;
                goto LAB_0010affa;
              }
              if (uVar16 < 1000) {
                uVar10 = uVar10 - 1;
                goto LAB_0010affa;
              }
              if (uVar16 < 10000) goto LAB_0010affa;
              bVar21 = 99999 < uVar16;
              uVar16 = uVar16 / 10000;
              uVar7 = uVar10 + 4;
            } while (bVar21);
            uVar10 = uVar10 + 1;
          }
LAB_0010affa:
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_398,(ulong)uVar10,'\0');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_398._M_dataplus._M_p,(uint)local_398._M_string_length,uVar3);
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            uVar18 = local_3d8.field_2._M_allocated_capacity;
          }
          uVar1 = CONCAT44(local_398._M_string_length._4_4_,(uint)local_398._M_string_length) +
                  local_3d8._M_string_length;
          if ((ulong)uVar18 < uVar1) {
            uVar18 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              uVar18 = local_398.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < uVar1) goto LAB_0010b071;
            pbVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_398,0,0,local_3d8._M_dataplus._M_p,
                                 local_3d8._M_string_length);
          }
          else {
LAB_0010b071:
            pbVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (&local_3d8,local_398._M_dataplus._M_p,
                                 CONCAT44(local_398._M_string_length._4_4_,
                                          (uint)local_398._M_string_length));
          }
          local_3f8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
          paVar14 = &pbVar11->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p == paVar14) {
            local_3f8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_3f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          }
          else {
            local_3f8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_3f8._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar11->_M_string_length = 0;
          paVar14->_M_local_buf[0] = '\0';
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_3f8,": ");
          local_3b8 = (undefined1  [8])(pbVar11->_M_dataplus)._M_p;
          paVar14 = &pbVar11->field_2;
          if (local_3b8 == (undefined1  [8])paVar14) {
            local_3a8._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_3a8._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_3b8 = (undefined1  [8])&local_3a8;
          }
          else {
            local_3a8._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_3b0 = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8)
          ;
          if (local_3b8 != (undefined1  [8])&local_3a8) {
            operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != paVar2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_3d8,"Value mismatch; token value ",&pTVar13->value);
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_3d8," does not match ");
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar11->_M_dataplus)._M_p;
          paVar17 = &pbVar11->field_2;
          if (paVar14 == paVar17) {
            local_3f8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_3f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
          }
          else {
            local_3f8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_3f8._M_dataplus._M_p = (pointer)paVar14;
          }
          local_3f8._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_3f8,local_378._M_dataplus._M_p,local_378._M_string_length);
          local_3b8 = (undefined1  [8])(pbVar11->_M_dataplus)._M_p;
          paVar14 = &pbVar11->field_2;
          if (local_3b8 == (undefined1  [8])paVar14) {
            local_3a8._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_3a8._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_3b8 = (undefined1  [8])&local_3a8;
          }
          else {
            local_3a8._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_3b0 = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                     (char *)local_3b8,local_3b0);
          if (local_3b8 != (undefined1  [8])&local_3a8) {
            operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
          }
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_2d8._0_8_,local_2d8._8_8_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          bVar20 = 1;
          std::ostream::flush();
        }
        iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_358,*(char **)(&DAT_00115288 + (long)(int)pTVar13->type * 8));
        if (iVar9 != 0) {
          uVar3 = pTVar13->line_number;
          uVar10 = 1;
          if (9 < uVar3) {
            uVar16 = uVar3;
            uVar7 = 4;
            do {
              uVar10 = uVar7;
              if (uVar16 < 100) {
                uVar10 = uVar10 - 2;
                goto LAB_0010b35c;
              }
              if (uVar16 < 1000) {
                uVar10 = uVar10 - 1;
                goto LAB_0010b35c;
              }
              if (uVar16 < 10000) goto LAB_0010b35c;
              bVar21 = 99999 < uVar16;
              uVar16 = uVar16 / 10000;
              uVar7 = uVar10 + 4;
            } while (bVar21);
            uVar10 = uVar10 + 1;
          }
LAB_0010b35c:
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_2f8,(ulong)uVar10,'\0');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_2f8._M_dataplus._M_p,(uint)local_2f8._M_string_length,uVar3);
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&local_2f8,0,0,"Error on line ",0xe);
          local_318._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
          paVar14 = &pbVar11->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p == paVar14) {
            local_318.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_318.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_318._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_318.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_318._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_318,",");
          local_3d8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
          paVar14 = &pbVar11->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p == paVar14) {
            local_3d8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_3d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
          }
          else {
            local_3d8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_3d8._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          uVar3 = pTVar13->position_number;
          uVar10 = 1;
          if (9 < uVar3) {
            uVar16 = uVar3;
            uVar7 = 4;
            do {
              uVar10 = uVar7;
              if (uVar16 < 100) {
                uVar10 = uVar10 - 2;
                goto LAB_0010b4ad;
              }
              if (uVar16 < 1000) {
                uVar10 = uVar10 - 1;
                goto LAB_0010b4ad;
              }
              if (uVar16 < 10000) goto LAB_0010b4ad;
              bVar21 = 99999 < uVar16;
              uVar16 = uVar16 / 10000;
              uVar7 = uVar10 + 4;
            } while (bVar21);
            uVar10 = uVar10 + 1;
          }
LAB_0010b4ad:
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_398,(ulong)uVar10,'\0');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_398._M_dataplus._M_p,(uint)local_398._M_string_length,uVar3);
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            uVar18 = local_3d8.field_2._M_allocated_capacity;
          }
          uVar1 = CONCAT44(local_398._M_string_length._4_4_,(uint)local_398._M_string_length) +
                  local_3d8._M_string_length;
          if ((ulong)uVar18 < uVar1) {
            uVar18 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              uVar18 = local_398.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < uVar1) goto LAB_0010b524;
            pbVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_398,0,0,local_3d8._M_dataplus._M_p,
                                 local_3d8._M_string_length);
          }
          else {
LAB_0010b524:
            pbVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (&local_3d8,local_398._M_dataplus._M_p,
                                 CONCAT44(local_398._M_string_length._4_4_,
                                          (uint)local_398._M_string_length));
          }
          local_3f8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
          paVar14 = &pbVar11->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p == paVar14) {
            local_3f8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_3f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          }
          else {
            local_3f8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_3f8._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar11->_M_string_length = 0;
          paVar14->_M_local_buf[0] = '\0';
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_3f8,": ");
          local_3b8 = (undefined1  [8])(pbVar11->_M_dataplus)._M_p;
          paVar14 = &pbVar11->field_2;
          if (local_3b8 == (undefined1  [8])paVar14) {
            local_3a8._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_3a8._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_3b8 = (undefined1  [8])&local_3a8;
          }
          else {
            local_3a8._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_3b0 = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8)
          ;
          if (local_3b8 != (undefined1  [8])&local_3a8) {
            operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != paVar2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,*(char **)(&DAT_00115288 + (long)(int)pTVar13->type * 8),
                     (allocator<char> *)&local_2f8);
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&local_318,0,0,"Type mismatch; token type ",0x1a);
          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar11->_M_dataplus)._M_p;
          paVar17 = &pbVar11->field_2;
          if (paVar14 == paVar17) {
            local_3d8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_3d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
          }
          else {
            local_3d8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_3d8._M_dataplus._M_p = (pointer)paVar14;
          }
          local_3d8._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_3d8," does not match ");
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar11->_M_dataplus)._M_p;
          paVar17 = &pbVar11->field_2;
          if (paVar14 == paVar17) {
            local_3f8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_3f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
          }
          else {
            local_3f8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_3f8._M_dataplus._M_p = (pointer)paVar14;
          }
          local_3f8._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_3f8,local_358._M_dataplus._M_p,local_358._M_string_length);
          local_3b8 = (undefined1  [8])(pbVar11->_M_dataplus)._M_p;
          paVar14 = &pbVar11->field_2;
          if (local_3b8 == (undefined1  [8])paVar14) {
            local_3a8._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_3a8._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_3b8 = (undefined1  [8])&local_3a8;
          }
          else {
            local_3a8._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_3b0 = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                     (char *)local_3b8,local_3b0);
          if (local_3b8 != (undefined1  [8])&local_3a8) {
            operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != paVar2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_2d8._0_8_,local_2d8._8_8_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          bVar20 = 1;
          std::ostream::flush();
        }
        pTVar13 = tokenStream::getNext(local_280);
        if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
        }
      } while (pTVar13 != (Token *)0x0);
      bVar21 = (bool)(bVar20 ^ 1);
    }
LAB_0010b8e7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,
                      CONCAT71(local_378.field_2._M_allocated_capacity._1_7_,
                               local_378.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                               local_358.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,
                      CONCAT71(local_338.field_2._M_allocated_capacity._1_7_,
                               local_338.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2b8);
  }
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0],local_290[0] + 1);
  }
  return bVar21;
}

Assistant:

bool lexer_tester::test_file(string filepath) {
    po::path p(filepath);

    string path_to_answers = p.parent_path().string() + "_answers/" + p.stem().string() + ".txt";

    ifstream current_stream;
    current_stream.open(path_to_answers);

    if(!current_stream.is_open()) {
        string message = "Error: Cannot open " + path_to_answers;
        print(message);
        return false;
    }

    tokenStream *token_stream = lexer::parsefile(filepath);

    vector<string> file_tokens;

    string line;

    while(getline(current_stream,line)) {

        if(line.empty()) continue;

        vector<string> result;

        int last_comma_index = line.find_last_of(',');

        string value = line.substr(0,last_comma_index);
        string type = line.substr(last_comma_index + 1);

        boost::trim(value);
        boost::trim(type);

        file_tokens.push_back(type);
        file_tokens.push_back(value);
    }

    reverse(file_tokens.begin(), file_tokens.end());

    Token *token;
    token = token_stream->getNext();

    bool errors = false;

    string type;
    string value;

    while(token) {

        if(file_tokens.size() >= 2) {
            type = file_tokens.back();
            file_tokens.pop_back();

            value = file_tokens.back();
            file_tokens.pop_back();
        }
        else {
            print("ERROR: Answer file doesn't have sufficient number of tokens");
            return false;
        }

        string error_message;

        if(token->value != value) {
            errors = true;

            error_message = "Error on line " + to_string(token->line_number) + "," +
                                   to_string(token->position_number) + ": ";
            error_message += "Value mismatch; token value " + token->value + " does not match " + value;

            print(error_message);
        }

        if(token_type_names[(int) token->type - 1] != type) {
            errors = true;

            error_message = "Error on line " + to_string(token->line_number) + "," +
                            to_string(token->position_number) + ": ";
            error_message += "Type mismatch; token type " + string(token_type_names[(int) token->type - 1]) +
                    " does not match " + type;

            print(error_message);

        }

        token = token_stream->getNext();
    }


    return !errors;
}